

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel_art.cpp
# Opt level: O0

void make_panda(void)

{
  undefined1 local_93d [8];
  ppm<26U,_22U> some;
  uchar bytes [599];
  
  memcpy(some.bytes + 0x6cd,
         "   ###              ###     ##### ########## #####   #######          #######  ####                ####  ###                  ###   #                    #    #                    #   #    ###        ###    #  #   #####      #####   #  #  #### #      # ####  #  #  #### #      # ####  #  #  #####        #####  #  #   ###    ##    ###   #   #         ##         #    ####  RRR    RRR  ####   ######RRRRR  RRRRR######  ######RRRRRRRRRRRR######  ######RRRRRRRRRRRR######  ######RRRRRRRRRRRR######  #######RRRRRRRRRR#######   #####  RRRRRRRR  ####      ###    RRRRRR    ##               RRRR           "
         ,599);
  memcpy(local_93d,&DAT_00102391,0x6d5);
  ppm<26U,_22U>::save((ppm<26U,_22U> *)local_93d,"panda.ppm");
  return;
}

Assistant:

void make_panda() {
  constexpr unsigned char bytes[] = "   ###              ###   "
                                    "  ##### ########## #####  "
                                    " #######          ####### "
                                    " ####                #### "
                                    " ###                  ### "
                                    "  #                    #  "
                                    "  #                    #  "
                                    " #    ###        ###    # "
                                    " #   #####      #####   # "
                                    " #  #### #      # ####  # "
                                    " #  #### #      # ####  # "
                                    " #  #####        #####  # "
                                    " #   ###    ##    ###   # "
                                    "  #         ##         #  "
                                    "  ####  RRR    RRR  ####  "
                                    " ######RRRRR  RRRRR###### "
                                    " ######RRRRRRRRRRRR###### "
                                    " ######RRRRRRRRRRRR###### "
                                    " ######RRRRRRRRRRRR###### "
                                    " #######RRRRRRRRRR####### "
                                    "  #####  RRRRRRRR  ####   "
                                    "   ###    RRRRRR    ##    "
                                    "           RRRR           ";
  constexpr ppm<26, 22> some{bytes};
  some.save("panda.ppm");
}